

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_csv.cpp
# Opt level: O2

string * duckdb::AddEscapes(string *__return_storage_ptr__,char to_be_escaped,char escape,
                           string *val)

{
  undefined4 in_EAX;
  ulong uVar1;
  undefined7 in_register_00000031;
  char cVar2;
  ulong uVar3;
  ulong uVar4;
  undefined4 uStack_38;
  int local_34;
  
  uVar3 = CONCAT71(in_register_00000031,to_be_escaped) & 0xffffffff;
  uStack_38 = in_EAX;
  ::std::__cxx11::string::string
            ((string *)__return_storage_ptr__,anon_var_dwarf_3b6586a + 9,
             (allocator *)((long)&uStack_38 + 3));
  uVar4 = 0;
  uVar1 = ::std::__cxx11::string::find((char)val,uVar3);
  _uStack_38 = CONCAT44((int)escape,uStack_38);
  while (cVar2 = (char)__return_storage_ptr__, uVar1 != 0xffffffffffffffff) {
    for (; uVar4 < uVar1; uVar4 = uVar4 + 1) {
      ::std::__cxx11::string::push_back(cVar2);
    }
    if (escape != '\0') {
      ::std::__cxx11::string::push_back(cVar2);
      uVar1 = ::std::__cxx11::string::find((char)val,(ulong)(uint)(int)(char)uVar3);
    }
  }
  for (; uVar4 < val->_M_string_length; uVar4 = uVar4 + 1) {
    ::std::__cxx11::string::push_back(cVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

static string AddEscapes(char to_be_escaped, const char escape, const string &val) {
	idx_t i = 0;
	string new_val = "";
	idx_t found = val.find(to_be_escaped);

	while (found != string::npos) {
		while (i < found) {
			new_val += val[i];
			i++;
		}
		if (escape != '\0') {
			new_val += escape;
			found = val.find(to_be_escaped, found + 1);
		}
	}
	while (i < val.length()) {
		new_val += val[i];
		i++;
	}
	return new_val;
}